

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_logs_test.cpp
# Opt level: O0

void __thiscall
metacall_logs_test_DefaultConstructor_Test::TestBody
          (metacall_logs_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  metacall_log_stdio_type log_stdio;
  int *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  char *in_stack_ffffffffffffff68;
  AssertHelper local_80;
  Message local_78;
  undefined4 local_70;
  undefined4 local_6c;
  AssertionResult local_68;
  uint local_54;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_30;
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  undefined8 local_10 [2];
  
  local_10[0] = _stdout;
  metacall_print_info();
  local_14 = 0;
  while( true ) {
    if (0x31 < local_14) {
      local_6c = 0;
      local_70 = metacall_initialize();
      this_00 = &local_68;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_ffffffffffffff68,
                 (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (int *)this_00,in_stack_ffffffffffffff50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
      if (!bVar1) {
        testing::Message::Message(&local_78);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x10ab41);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_logs_test/source/metacall_logs_test.cpp"
                   ,0x29,message);
        testing::internal::AssertHelper::operator=(&local_80,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        testing::Message::~Message((Message *)0x10ab8f);
      }
      local_54 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10abe5);
      if (local_54 == 0) {
        metacall_destroy();
      }
      return;
    }
    local_2c = 0;
    local_30 = metacall_log(0,local_10);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_ffffffffffffff68,
               (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
    if (!bVar1) {
      testing::Message::Message(local_48);
      in_stack_ffffffffffffff68 =
           testing::AssertionResult::failure_message((AssertionResult *)0x10a9de);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_logs_test/source/metacall_logs_test.cpp"
                 ,0x26,in_stack_ffffffffffffff68);
      testing::internal::AssertHelper::operator=(&local_50,local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::Message::~Message((Message *)0x10aa2c);
    }
    local_54 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10aa85);
    if (local_54 != 0) break;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

TEST_F(metacall_logs_test, DefaultConstructor)
{
	metacall_log_stdio_type log_stdio = { stdout };

	metacall_print_info();

	for (int i = 0; i < 50; ++i)
	{
		ASSERT_EQ((int)0, (int)metacall_log(METACALL_LOG_STDIO, (void *)&log_stdio));
	}

	ASSERT_EQ((int)0, (int)metacall_initialize());

	metacall_destroy();
}